

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O1

void __thiscall DSFrame::~DSFrame(DSFrame *this)

{
  VSFrameRef *pVVar1;
  
  if (this->SrcPointers != (uchar **)0x0) {
    operator_delete__(this->SrcPointers);
  }
  if (this->DstPointers != (uchar **)0x0) {
    operator_delete__(this->DstPointers);
  }
  if (this->StrideBytes != (int *)0x0) {
    operator_delete__(this->StrideBytes);
  }
  pVVar1 = this->_vsdst;
  if ((pVVar1 != (VSFrameRef *)0x0) && (pVVar1 != this->_vssrc)) {
    (*this->_vsapi->freeFrame)(pVVar1);
  }
  if (this->_vssrc != (VSFrameRef *)0x0) {
    (*this->_vsapi->freeFrame)(this->_vssrc);
  }
  PVideoFrame::~PVideoFrame(&this->_avssrc);
  return;
}

Assistant:

~DSFrame()
  {
    if (SrcPointers)
      delete[] SrcPointers;
    if (DstPointers)
      delete[] DstPointers;
    if (StrideBytes)
      delete[] StrideBytes;
    if (_vsdst && _vsdst != _vssrc)
      _vsapi->freeFrame(_vsdst);
    if (_vssrc)
      _vsapi->freeFrame(_vssrc);
  }